

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O0

void __thiscall
miniros::TransportPublisherLink::onRetryTimer
          (TransportPublisherLink *this,SteadyTimerEvent *param_2)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  DurationBase<miniros::WallDuration> *pDVar6;
  element_type *peVar7;
  Connection *this_00;
  element_type *peVar8;
  undefined4 extraout_var;
  element_type *this_01;
  element_type *peVar9;
  string *psVar10;
  element_type *this_02;
  undefined8 uVar11;
  undefined8 uVar12;
  socklen_t __len;
  DurationBase<miniros::WallDuration> DVar13;
  long in_RDI;
  ConnectionPtr *in_stack_00000030;
  TransportPublisherLink *in_stack_00000038;
  bool enabled_1;
  ConnectionPtr connection;
  TransportTCPPtr transport;
  bool enabled;
  int port;
  string *host;
  TransportTCPPtr old_transport;
  string topic;
  SubscriptionPtr parent;
  char *in_stack_fffffffffffffd68;
  Level LVar14;
  function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
  *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  LogLocation *in_stack_fffffffffffffd80;
  shared_ptr<miniros::Transport> *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  LogLocation *in_stack_fffffffffffffda0;
  ConnectionPtr *in_stack_fffffffffffffda8;
  void *pvVar15;
  undefined4 in_stack_fffffffffffffdb0;
  Level LVar16;
  undefined4 in_stack_fffffffffffffdb4;
  PublisherLinkPtr *in_stack_fffffffffffffdd8;
  Subscription *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 is_server;
  bool local_179;
  allocator<char> local_159;
  string local_158 [96];
  PollSet *local_f8;
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [32];
  __shared_ptr local_48 [48];
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> local_18 [3];
  TransportPtr *transport_00;
  
  LVar16 = (Level)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  if ((*(byte *)(in_RDI + 0x138) & 1) == 0) {
    local_179 = false;
    if ((*(byte *)(in_RDI + 0x124) & 1) != 0) {
      local_18[0] = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
      local_179 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator>
                            (local_18,(SteadyTime *)(in_RDI + 0x130));
    }
    if (local_179 != false) {
      DurationBase<miniros::WallDuration>::operator*
                ((DurationBase<miniros::WallDuration> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 (double)in_stack_fffffffffffffd70);
      WallDuration::WallDuration
                ((WallDuration *)in_stack_fffffffffffffd80,
                 (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      pDVar6 = &std::min<miniros::WallDuration>
                          ((WallDuration *)in_stack_fffffffffffffd68,(WallDuration *)0x511bff)->
                super_DurationBase<miniros::WallDuration>;
      DVar13 = *pDVar6;
      *(DurationBase<miniros::WallDuration> *)(in_RDI + 0x128) = DVar13;
      WallDuration::~WallDuration((WallDuration *)0x511c30);
      __len = DVar13.sec;
      WallDuration::~WallDuration((WallDuration *)0x511c3d);
      *(undefined1 *)(in_RDI + 0x124) = 0;
      std::weak_ptr<miniros::Subscription>::lock
                ((weak_ptr<miniros::Subscription> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      peVar7 = std::
               __shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x511c71);
      this_00 = (Connection *)Connection::getTransport(peVar7);
      peVar8 = std::
               __shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x511c90);
      iVar3 = (*peVar8->_vptr_Transport[9])();
      transport_00 = (TransportPtr *)CONCAT44(extraout_var,iVar3);
      is_server = (undefined1)((ulong)&local_69 >> 0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (char *)in_stack_fffffffffffffda8,(allocator<char> *)in_stack_fffffffffffffda0);
      bVar1 = std::operator==((char *)in_stack_fffffffffffffd70,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd68);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator(&local_69);
      if ((bVar1 & 1) == 0) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_48);
        if (bVar2) {
          std::__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x512596);
          std::enable_shared_from_this<miniros::PublisherLink>::shared_from_this
                    ((enable_shared_from_this<miniros::PublisherLink> *)in_stack_fffffffffffffd68);
          Subscription::removePublisherLink(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          std::shared_ptr<miniros::PublisherLink>::~shared_ptr
                    ((shared_ptr<miniros::PublisherLink> *)0x5125d7);
        }
      }
      else {
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_48);
        if (bVar2) {
          this_01 = std::
                    __shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x511d49);
          psVar10 = Subscription::getName_abi_cxx11_(this_01);
          std::__cxx11::string::string(local_90,(string *)psVar10);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                     (char *)in_stack_fffffffffffffda8,(allocator<char> *)in_stack_fffffffffffffda0)
          ;
          std::allocator<char>::~allocator(&local_91);
        }
        peVar7 = std::
                 __shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x511dde);
        Connection::getTransport(peVar7);
        std::dynamic_pointer_cast<miniros::TransportTCP,miniros::Transport>
                  (in_stack_fffffffffffffd88);
        peVar9 = std::
                 __shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x511e1a);
        psVar10 = TransportTCP::getConnectedHost_abi_cxx11_(peVar9);
        iVar3 = (int)psVar10;
        peVar9 = std::
                 __shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x511e49);
        uVar4 = TransportTCP::getConnectedPort(peVar9);
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((onRetryTimer::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                     (char *)in_stack_fffffffffffffda8,(allocator<char> *)in_stack_fffffffffffffda0)
          ;
          console::initializeLogLocation
                    (in_stack_fffffffffffffda0,
                     (string *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),LVar16)
          ;
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
        }
        if (onRetryTimer::loc.level_ != Debug) {
          console::setLogLocationLevel
                    ((LogLocation *)in_stack_fffffffffffffd70,
                     (Level)((ulong)in_stack_fffffffffffffd68 >> 0x20));
          console::checkLogLocationEnabled(in_stack_fffffffffffffd80);
        }
        pvVar15 = onRetryTimer::loc.logger_;
        LVar14 = onRetryTimer::loc.level_;
        if ((onRetryTimer::loc.logger_enabled_ & 1U) != 0) {
          in_stack_fffffffffffffd70 =
               (function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                *)std::__cxx11::string::c_str();
          in_stack_fffffffffffffd80 = (LogLocation *)std::__cxx11::string::c_str();
          in_stack_fffffffffffffd68 = "Retrying connection to [%s:%d] for topic [%s]";
          __len = 0x580165;
          console::print((FilterBase *)0x0,pvVar15,(Level)(ulong)LVar14,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp"
                         ,0x110,
                         "void miniros::TransportPublisherLink::onRetryTimer(const miniros::SteadyTimerEvent &)"
                         ,"Retrying connection to [%s:%d] for topic [%s]",in_stack_fffffffffffffd70,
                         uVar4);
        }
        PollManager::instance();
        this_02 = std::
                  __shared_ptr_access<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x512188);
        local_f8 = PollManager::getPollSet(this_02);
        std::make_shared<miniros::TransportTCP,miniros::PollSet*>
                  ((PollSet **)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        peVar9 = std::
                 __shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x5121ce);
        uVar5 = TransportTCP::connect(peVar9,iVar3,(sockaddr *)(ulong)uVar4,__len);
        if ((uVar5 & 1) == 0) {
          if (((console::g_initialized ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          LVar14 = (Level)((ulong)in_stack_fffffffffffffd68 >> 0x20);
          if (((onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.initialized_ ^ 0xffU) & 1) != 0)
          {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                       (char *)in_stack_fffffffffffffda8,
                       (allocator<char> *)in_stack_fffffffffffffda0);
            console::initializeLogLocation
                      (in_stack_fffffffffffffda0,
                       (string *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       LVar16);
            std::__cxx11::string::~string(local_158);
            std::allocator<char>::~allocator(&local_159);
          }
          if (onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.level_ != Debug) {
            console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffd70,LVar14);
            console::checkLogLocationEnabled(in_stack_fffffffffffffd80);
          }
          if ((onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.logger_enabled_ & 1U) != 0) {
            pvVar15 = onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.logger_;
            LVar16 = onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.level_;
            uVar11 = std::__cxx11::string::c_str();
            uVar12 = std::__cxx11::string::c_str();
            console::print((FilterBase *)0x0,pvVar15,(Level)(ulong)LVar16,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp"
                           ,0x11e,
                           "void miniros::TransportPublisherLink::onRetryTimer(const miniros::SteadyTimerEvent &)"
                           ,"connect() failed when retrying connection to [%s:%d] for topic [%s]",
                           uVar11,uVar4,uVar12);
          }
        }
        else {
          std::make_shared<miniros::Connection>();
          std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x51221a);
          std::shared_ptr<miniros::Transport>::shared_ptr<miniros::TransportTCP,void>
                    ((shared_ptr<miniros::Transport> *)in_stack_fffffffffffffd70,
                     (shared_ptr<miniros::TransportTCP> *)in_stack_fffffffffffffd68);
          std::
          function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>::
          function(in_stack_fffffffffffffd70);
          Connection::initialize
                    (this_00,transport_00,(bool)is_server,
                     (HeaderReceivedFunc *)CONCAT17(bVar1,in_stack_fffffffffffffe58));
          std::
          function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>::
          ~function((function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                     *)0x512270);
          std::shared_ptr<miniros::Transport>::~shared_ptr
                    ((shared_ptr<miniros::Transport> *)0x51227d);
          bVar2 = initialize(in_stack_00000038,in_stack_00000030);
          if (bVar2) {
            ConnectionManager::instance();
            std::
            __shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x5122bb);
            ConnectionManager::addConnection
                      ((ConnectionManager *)
                       CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                       in_stack_fffffffffffffda8);
          }
          std::shared_ptr<miniros::Connection>::~shared_ptr
                    ((shared_ptr<miniros::Connection> *)0x51233b);
        }
        std::shared_ptr<miniros::TransportTCP>::~shared_ptr
                  ((shared_ptr<miniros::TransportTCP> *)0x51252b);
        std::shared_ptr<miniros::TransportTCP>::~shared_ptr
                  ((shared_ptr<miniros::TransportTCP> *)0x512538);
        std::__cxx11::string::~string(local_90);
      }
      std::shared_ptr<miniros::Subscription>::~shared_ptr
                ((shared_ptr<miniros::Subscription> *)0x51260b);
    }
  }
  return;
}

Assistant:

void TransportPublisherLink::onRetryTimer(const miniros::SteadyTimerEvent&)
{
  if (dropping_)
  {
    return;
  }

  if (needs_retry_ && SteadyTime::now() > next_retry_)
  {
    retry_period_ = std::min<WallDuration>(retry_period_ * 2, WallDuration(20));
    needs_retry_ = false;
    SubscriptionPtr parent = parent_.lock();
    // TODO: support retry on more than just TCP
    // For now, since UDP does not have a heartbeat, we do not attempt to retry
    // UDP connections since an error there likely means some invalid operation has
    // happened.
    if (connection_->getTransport()->getType() == std::string("TCPROS"))
    {
      std::string topic = parent ? parent->getName() : "unknown";

      TransportTCPPtr old_transport = std::dynamic_pointer_cast<TransportTCP>(connection_->getTransport());
      MINIROS_ASSERT(old_transport);
      const std::string& host = old_transport->getConnectedHost();
      int port = old_transport->getConnectedPort();

      MINIROS_DEBUG("Retrying connection to [%s:%d] for topic [%s]", host.c_str(), port, topic.c_str());

      TransportTCPPtr transport(std::make_shared<TransportTCP>(&PollManager::instance()->getPollSet()));
      if (transport->connect(host, port))
      {
        ConnectionPtr connection(std::make_shared<Connection>());
        connection->initialize(transport, false, HeaderReceivedFunc());
        if (initialize(connection))
        {
          ConnectionManager::instance()->addConnection(connection);
        }
      }
      else
      {
        MINIROS_DEBUG("connect() failed when retrying connection to [%s:%d] for topic [%s]", host.c_str(), port, topic.c_str());
      }
    }
    else if (parent)
    {
      parent->removePublisherLink(shared_from_this());
    }
  }
}